

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptIntBounds.cpp
# Opt level: O1

ValueInfo * __thiscall
GlobOpt::UpdateIntBoundsForLessThanOrEqual
          (GlobOpt *this,Value *value,IntConstantBounds *constantBounds,Value *boundValue,
          IntConstantBounds *boundConstantBounds,int boundOffset,bool isExplicit)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  IntBounds *this_00;
  IntBoundedValueInfo *pIVar4;
  ValueInfo *pVVar5;
  int iVar6;
  int local_38;
  int local_34;
  int32 adjustedBoundMax;
  
  local_34 = boundOffset;
  if ((value == (Value *)0x0) && (constantBounds->lowerBound != constantBounds->upperBound)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x27d,"(value || constantBounds.IsConstant())",
                       "value || constantBounds.IsConstant()");
    if (!bVar2) goto LAB_004a9c73;
    *puVar3 = 0;
  }
  if ((boundValue == (Value *)0x0) &&
     (boundConstantBounds->lowerBound != boundConstantBounds->upperBound)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                       ,0x27e,"(boundValue || boundConstantBounds.IsConstant())",
                       "boundValue || boundConstantBounds.IsConstant()");
    if (!bVar2) goto LAB_004a9c73;
    *puVar3 = 0;
  }
  if (value != (Value *)0x0) {
    if ((boundValue != (Value *)0x0) && (value->valueNumber == boundValue->valueNumber)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptIntBounds.cpp"
                         ,0x283,
                         "(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber())",
                         "!boundValue || value->GetValueNumber() != boundValue->GetValueNumber()");
      if (!bVar2) {
LAB_004a9c73:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    pVVar5 = value->valueInfo;
    this_00 = GetIntBoundsToUpdate
                        (this,pVVar5,constantBounds,true,
                         boundConstantBounds->lowerBound == boundConstantBounds->upperBound,true,
                         isExplicit);
    if (this_00 != (IntBounds *)0x0) {
      if (boundValue == (Value *)0x0) {
        IntBounds::SetUpperBound(this_00,boundConstantBounds->lowerBound,local_34,isExplicit);
      }
      else {
        IntBounds::SetUpperBound(this_00,value->valueNumber,boundValue,local_34,isExplicit);
      }
      bVar2 = IntBounds::RequiresIntBoundedValueInfo
                        (this_00,(ValueType)
                                 *(anon_union_2_4_ea848c7b_for_ValueType_13 *)
                                  &(pVVar5->super_ValueType).field_0.field_0);
      if (bVar2) {
        pIVar4 = NewIntBoundedValueInfo(this,pVVar5,this_00);
        return &pIVar4->super_ValueInfo;
      }
      IntBounds::Delete(this_00);
    }
    bVar2 = ValueType::IsInt(&pVVar5->super_ValueType);
    if (bVar2) {
      iVar6 = boundConstantBounds->upperBound;
      if (local_34 == -1) {
        iVar6 = iVar6 + -1;
      }
      else if ((local_34 != 0) &&
              (bVar2 = Int32Math::Add(iVar6,local_34,&local_38), iVar6 = local_38, bVar2)) {
        return (ValueInfo *)0x0;
      }
      local_38 = iVar6;
      iVar6 = local_38;
      if (constantBounds->upperBound < local_38) {
        iVar6 = constantBounds->upperBound;
      }
      if (constantBounds->lowerBound <= iVar6) {
        pVVar5 = NewIntRangeValueInfo(this,pVVar5,constantBounds->lowerBound,iVar6);
        return pVVar5;
      }
    }
  }
  return (ValueInfo *)0x0;
}

Assistant:

ValueInfo *GlobOpt::UpdateIntBoundsForLessThanOrEqual(
    Value *const value,
    const IntConstantBounds &constantBounds,
    Value *const boundValue,
    const IntConstantBounds &boundConstantBounds,
    const int boundOffset,
    const bool isExplicit)
{
    Assert(value || constantBounds.IsConstant());
    Assert(boundValue || boundConstantBounds.IsConstant());
    if(!value)
    {
        return nullptr;
    }
    Assert(!boundValue || value->GetValueNumber() != boundValue->GetValueNumber());

    ValueInfo *const valueInfo = value->GetValueInfo();
    IntBounds *const bounds =
        GetIntBoundsToUpdate(valueInfo, constantBounds, true, boundConstantBounds.IsConstant(), true, isExplicit);
    if(bounds)
    {
        if(boundValue)
        {
            bounds->SetUpperBound(value->GetValueNumber(), boundValue, boundOffset, isExplicit);
        }
        else
        {
            bounds->SetUpperBound(boundConstantBounds.LowerBound(), boundOffset, isExplicit);
        }
        if(bounds->RequiresIntBoundedValueInfo(valueInfo->Type()))
        {
            return NewIntBoundedValueInfo(valueInfo, bounds);
        }
        bounds->Delete();
    }

    if(!valueInfo->IsInt())
    {
        return nullptr;
    }

    int32 adjustedBoundMax;
    if(boundOffset == 0)
    {
        adjustedBoundMax = boundConstantBounds.UpperBound();
    }
    else if(boundOffset == -1)
    {
        if(boundConstantBounds.UpperBound() - 1 >= boundConstantBounds.UpperBound())
        {
            return nullptr;
        }
        adjustedBoundMax = boundConstantBounds.UpperBound() - 1;
    }
    else if(Int32Math::Add(boundConstantBounds.UpperBound(), boundOffset, &adjustedBoundMax))
    {
        return nullptr;
    }
    const int32 newMax = min(constantBounds.UpperBound(), adjustedBoundMax);
    return
        newMax >= constantBounds.LowerBound()
            ? NewIntRangeValueInfo(valueInfo, constantBounds.LowerBound(), newMax)
            : nullptr;
}